

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

void cscal(int n,complex<float> ca,complex<float> *cx,int incx)

{
  ulong uVar1;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM0_Db;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  
  if (0 < (int)cx && 0 < n) {
    if ((int)cx == 1) {
      uVar1 = 0;
      do {
        fVar4 = *(float *)(ca._M_value + uVar1 * 8);
        fVar5 = *(float *)(ca._M_value + 4 + uVar1 * 8);
        fVar2 = in_XMM0_Da * fVar4 - in_XMM0_Db * fVar5;
        fVar4 = in_XMM0_Db * fVar4 + in_XMM0_Da * fVar5;
        uVar3 = CONCAT44(fVar4,fVar2);
        if ((NAN(fVar2)) && (uVar3 = CONCAT44(fVar4,fVar2), NAN(fVar4))) {
          uVar3 = __mulsc3(in_XMM0_Da);
        }
        *(undefined8 *)(ca._M_value + uVar1 * 8) = uVar3;
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
    else {
      uVar1 = (ulong)(uint)n;
      do {
        fVar4 = in_XMM0_Da * *(float *)ca._M_value - in_XMM0_Db * *(float *)(ca._M_value + 4);
        fVar5 = in_XMM0_Db * *(float *)ca._M_value + in_XMM0_Da * *(float *)(ca._M_value + 4);
        uVar3 = CONCAT44(fVar5,fVar4);
        if ((NAN(fVar4)) && (uVar3 = CONCAT44(fVar5,fVar4), NAN(fVar5))) {
          uVar3 = __mulsc3(in_XMM0_Da);
        }
        *(undefined8 *)ca._M_value = uVar3;
        ca._M_value = ca._M_value + ((ulong)cx & 0xffffffff) * 2 * 4;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

void cscal ( int n, complex <float> ca, complex <float> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    CSCAL scales a vector by a constant.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> CA, the multiplier.
//
//    Input/output, complex <float> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = ca * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = ca * cx[i*incx];
    }
  }
  return;
}